

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Port * __thiscall
kratos::Generator::port(Generator *this,EnumPort *port,string *port_name,bool check_param)

{
  undefined1 auVar1 [8];
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  __shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  PortDirection local_5c;
  Generator *local_58;
  undefined4 local_4c;
  undefined1 local_48 [8];
  shared_ptr<kratos::EnumPort> p;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,check_param);
  iVar2 = (*(port->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2c])(port);
  local_5c = (port->super_Port).direction_;
  local_58 = this;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            (local_70,(__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)
                      CONCAT44(extraout_var,iVar2));
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::EnumPort,std::allocator<kratos::EnumPort>,kratos::Generator*,kratos::PortDirection,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,(EnumPort **)local_48,
             (allocator<kratos::EnumPort> *)
             ((long)&p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7),&local_58,&local_5c,port_name,(shared_ptr<kratos::Enum> *)local_70);
  std::__shared_ptr<kratos::EnumPort,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::EnumPort,kratos::EnumPort>
            ((__shared_ptr<kratos::EnumPort,(__gnu_cxx::_Lock_policy)2> *)local_48,
             (EnumPort *)local_48);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumPort>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::EnumPort> *)local_48);
  Var::copy_meta_data((Var *)port,(Var *)local_48,local_4c._0_1_);
  auVar1 = local_48;
  if (p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return &((EnumPort *)auVar1)->super_Port;
}

Assistant:

Port &Generator::port(const EnumPort &port, const std::string &port_name, bool check_param) {
    auto *enum_type = const_cast<Enum *>(port.enum_type());
    auto p = std::make_shared<EnumPort>(this, port.port_direction(), port_name,
                                        enum_type->shared_from_this());
    add_port_name(port_name);
    vars_.emplace(port_name, p);

    port.copy_meta_data(p.get(), check_param);

    return *p;
}